

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O2

void Amap_LibVerifyPerm(Amap_Lib_t *pLib,Amap_Gat_t *pGate,Kit_DsdNtk_t *pNtk,Amap_Nod_t *pNod,
                       int *pArray)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  Vec_Int_t *p;
  Amap_Nod_t *pAVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  void **ppvVar8;
  ulong uVar9;
  Vec_Ptr_t *vTtElems;
  uint *puVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int iInput;
  Vec_Ptr_t *local_60;
  Kit_DsdNtk_t *local_58;
  Vec_Int_t *local_50;
  Amap_Lib_t *local_48;
  Amap_Nod_t *local_40;
  int *local_38;
  
  iInput = 0;
  uVar16 = *(uint *)&pGate->field_0x38;
  local_58 = pNtk;
  local_48 = pLib;
  local_40 = pNod;
  local_38 = pArray;
  if (uVar16 < 0x2000000) {
    __assert_fail("pGate->nPins > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
                  ,0x122,
                  "void Amap_LibVerifyPerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, int *)"
                 );
  }
  bVar11 = (char)(uVar16 >> 0x18) - 5;
  iVar7 = 0xf << (bVar11 & 0x1f);
  if (uVar16 < 0x6000000) {
    iVar7 = 0xf;
  }
  local_50 = Vec_IntAlloc(iVar7);
  uVar15 = *(uint *)&pGate->field_0x38;
  uVar18 = uVar15 >> 0x18;
  uVar17 = (ulong)uVar18;
  uVar14 = 1 << ((char)(uVar15 >> 0x18) - 5U & 0x1f);
  if (uVar15 < 0x6000000) {
    uVar14 = 1;
  }
  ppvVar8 = (void **)malloc(((long)(int)uVar14 * 4 + 8) * uVar17);
  uVar9 = (ulong)(uVar18 * 8);
  for (uVar12 = 0; uVar17 != uVar12; uVar12 = uVar12 + 1) {
    ppvVar8[uVar12] = (void *)((long)ppvVar8 + uVar9);
    uVar9 = uVar9 + (long)(int)uVar14 * 4;
  }
  local_60 = (Vec_Ptr_t *)malloc(0x10);
  local_60->nSize = uVar18;
  local_60->nCap = uVar18;
  local_60->pArray = ppvVar8;
  uVar12 = 0;
  uVar9 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar9 = uVar12;
  }
  for (; uVar12 != uVar17; uVar12 = uVar12 + 1) {
    pvVar1 = ppvVar8[uVar12];
    if (uVar12 < 5) {
      for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
        *(undefined4 *)((long)pvVar1 + uVar13 * 4) = (&DAT_00727810)[uVar12];
      }
    }
    else {
      for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
        *(uint *)((long)pvVar1 + uVar13 * 4) =
             -(uint)((1 << ((char)uVar12 - 5U & 0x1f) & (uint)uVar13) != 0);
      }
    }
  }
  iVar7 = 1 << (bVar11 & 0x1f);
  if (uVar16 < 0x6000000) {
    iVar7 = 1;
  }
  uVar16 = *(uint *)&pGate->field_0x38;
  vTtElems = (Vec_Ptr_t *)malloc(0x10);
  uVar15 = 8;
  if (6 < (uVar16 >> 0x18) - 1) {
    uVar15 = uVar16 >> 0x18;
  }
  vTtElems->nSize = 0;
  vTtElems->nCap = uVar15;
  uVar14 = 0;
  if (uVar15 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((ulong)(uVar15 * 8));
  }
  vTtElems->pArray = ppvVar8;
  for (uVar17 = 0; piVar5 = local_38, pAVar4 = local_40, p = local_50, uVar17 < uVar16 >> 0x18;
      uVar17 = uVar17 + 1) {
    iVar6 = Abc_Lit2Var(local_38[uVar17]);
    puVar10 = (uint *)Vec_PtrEntry(local_60,iVar6);
    iVar6 = Abc_LitIsCompl(piVar5[uVar17]);
    if (iVar6 != 0) {
      Kit_TruthNot(puVar10,puVar10,(uint)(byte)pGate->field_0x3b);
    }
    uVar16 = uVar14;
    if (uVar14 == uVar15) {
      uVar9 = (ulong)(uVar15 * 2);
      if ((int)uVar15 < 0x10) {
        uVar9 = 0x10;
      }
      uVar14 = (uint)uVar9;
      uVar16 = uVar15;
      if ((int)uVar15 < (int)uVar14) {
        if (ppvVar8 == (void **)0x0) {
          ppvVar8 = (void **)malloc(uVar9 << 3);
        }
        else {
          ppvVar8 = (void **)realloc(ppvVar8,uVar9 << 3);
          uVar15 = vTtElems->nSize;
        }
        vTtElems->pArray = ppvVar8;
        vTtElems->nCap = uVar14;
        uVar16 = uVar15;
        uVar15 = uVar14;
      }
    }
    uVar14 = uVar16 + 1;
    vTtElems->nSize = uVar14;
    ppvVar8[(int)uVar16] = puVar10;
    uVar16 = *(uint *)&pGate->field_0x38;
  }
  puVar10 = Amap_LibVerifyPerm_rec(local_48,local_40,vTtElems,local_50,iVar7,&iInput);
  if (iInput != (uint)(byte)pGate->field_0x3b) {
    __assert_fail("iInput == (int)pGate->nPins",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
                  ,0x132,
                  "void Amap_LibVerifyPerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, int *)"
                 );
  }
  iVar7 = Abc_LitIsCompl((uint)local_58->Root);
  if (iVar7 != 0) {
    Kit_TruthNot(puVar10,puVar10,(uint)(byte)pGate->field_0x3b);
  }
  uVar16 = *(uint *)&pGate->field_0x38;
  uVar17 = (ulong)(uint)(1 << ((char)(uVar16 >> 0x18) - 5U & 0x1f));
  if (uVar16 < 0x6000000) {
    uVar17 = 1;
  }
  do {
    if ((int)uVar17 < 1) goto LAB_003517ee;
    lVar2 = uVar17 - 1;
    lVar3 = uVar17 - 1;
    uVar17 = uVar17 - 1;
  } while (pGate->pFunc[lVar2] == puVar10[lVar3]);
  printf("Verification failed for gate %d (%s) and node %d.\n",(ulong)(uVar16 & 0x7fffff),
         pGate->pForm,(ulong)*(ushort *)pAVar4);
LAB_003517ee:
  Vec_IntFree(p);
  Vec_PtrFree(local_60);
  Vec_PtrFree(vTtElems);
  return;
}

Assistant:

void Amap_LibVerifyPerm( Amap_Lib_t * pLib, Amap_Gat_t * pGate, Kit_DsdNtk_t * pNtk, Amap_Nod_t * pNod, int * pArray )
{
    Vec_Ptr_t * vTtElems;
    Vec_Ptr_t * vTtElemsPol;
    Vec_Int_t * vTruth;
    unsigned * pTruth;
    int i, nWords;
    int iInput = 0;

    // allocate storage for truth tables
    assert( pGate->nPins > 1 );
    nWords = Kit_TruthWordNum( pGate->nPins );
    vTruth = Vec_IntAlloc( nWords * AMAP_MAXINS );
    vTtElems = Vec_PtrAllocTruthTables( pGate->nPins );
    vTtElemsPol = Vec_PtrAlloc( pGate->nPins );
    for ( i = 0; i < (int)pGate->nPins; i++ )
    {
        pTruth = (unsigned *)Vec_PtrEntry( vTtElems, Abc_Lit2Var(pArray[i]) );
        if ( Abc_LitIsCompl( pArray[i] ) )
            Kit_TruthNot( pTruth, pTruth, pGate->nPins );
        Vec_PtrPush( vTtElemsPol, pTruth );
    }
//Extra_PrintBinary( stdout, Vec_PtrEntry(vTtElemsPol, 0), 4 ); printf("\n" );
//Extra_PrintBinary( stdout, Vec_PtrEntry(vTtElemsPol, 1), 4 ); printf("\n" );
    // compute the truth table recursively
    pTruth = Amap_LibVerifyPerm_rec( pLib, pNod, vTtElemsPol, vTruth, nWords, &iInput );
    assert( iInput == (int)pGate->nPins );
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruth, pTruth, pGate->nPins );
//Extra_PrintBinary( stdout, pTruth, 4 ); printf("\n" );
//Extra_PrintBinary( stdout, pGate->pFunc, 4 ); printf("\n" );
    // compare
    if ( !Kit_TruthIsEqual(pGate->pFunc, pTruth, pGate->nPins) )
        printf( "Verification failed for gate %d (%s) and node %d.\n",
            pGate->Id, pGate->pForm, pNod->Id );
    Vec_IntFree( vTruth );
    Vec_PtrFree( vTtElems );
    Vec_PtrFree( vTtElemsPol );
}